

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot_items.cpp
# Opt level: O2

void ImPlot::PlotBarsHEx<ImPlot::GetterXsYs<short>,double>
               (char *label_id,GetterXsYs<short> *getter,double height)

{
  ImPlotNextItemData *col;
  bool bVar1;
  ImPlotContext *pIVar2;
  bool bVar3;
  ImU32 col_00;
  ImU32 col_01;
  ImDrawList *this;
  int i;
  int iVar4;
  int i_1;
  double x;
  ImPlotPoint IVar5;
  ImVec2 a;
  ImVec2 b;
  
  bVar3 = BeginItem(label_id,1);
  if (bVar3) {
    if (GImPlot->FitThisFrame == true) {
      for (iVar4 = 0; iVar4 < getter->Count; iVar4 = iVar4 + 1) {
        IVar5 = GetterXsYs<short>::operator()(getter,iVar4);
        a.x = 0.0;
        a.y = 0.0;
        FitPoint((ImPlotPoint *)&a);
        a = (ImVec2)IVar5.x;
        FitPoint((ImPlotPoint *)&a);
      }
    }
    pIVar2 = GImPlot;
    col = &GImPlot->NextItemData;
    this = GetPlotDrawList();
    col_00 = ImGui::GetColorU32(col->Colors);
    col_01 = ImGui::GetColorU32((pIVar2->NextItemData).Colors + 1);
    bVar3 = (pIVar2->NextItemData).RenderFill;
    bVar1 = (pIVar2->NextItemData).RenderLine;
    for (iVar4 = 0; iVar4 < getter->Count; iVar4 = iVar4 + 1) {
      IVar5 = GetterXsYs<short>::operator()(getter,iVar4);
      x = IVar5.x;
      if ((x != 0.0) || (NAN(x))) {
        a = PlotToPixels(0.0,IVar5.y - height * 0.5,-1);
        b = PlotToPixels(x,IVar5.y + height * 0.5,-1);
        if ((pIVar2->NextItemData).RenderFill == true) {
          ImDrawList::AddRectFilled(this,&a,&b,col_01,0.0,0);
        }
        if (((col_00 != col_01 | bVar3 ^ 1U) & bVar1) != 0) {
          ImDrawList::AddRect(this,&a,&b,col_00,0.0,0xf0,(pIVar2->NextItemData).LineWeight);
        }
      }
    }
    EndItem();
  }
  return;
}

Assistant:

void PlotBarsHEx(const char* label_id, const Getter& getter, THeight height) {
    if (BeginItem(label_id, ImPlotCol_Fill)) {
        const THeight half_height = height / 2;
        if (FitThisFrame()) {
            for (int i = 0; i < getter.Count; ++i) {
                ImPlotPoint p = getter(i);
                FitPoint(ImPlotPoint(0, p.y - half_height));
                FitPoint(ImPlotPoint(p.x, p.y + half_height));
            }
        }
        const ImPlotNextItemData& s = GetItemData();
        ImDrawList& DrawList = *GetPlotDrawList();
        ImU32 col_line  = ImGui::GetColorU32(s.Colors[ImPlotCol_Line]);
        ImU32 col_fill  = ImGui::GetColorU32(s.Colors[ImPlotCol_Fill]);
        bool  rend_line = s.RenderLine;
        if (s.RenderFill && col_line == col_fill)
            rend_line = false;
        for (int i = 0; i < getter.Count; ++i) {
            ImPlotPoint p = getter(i);
            if (p.x == 0)
                continue;
            ImVec2 a = PlotToPixels(0, p.y - half_height);
            ImVec2 b = PlotToPixels(p.x, p.y + half_height);
            if (s.RenderFill)
                DrawList.AddRectFilled(a, b, col_fill);
            if (rend_line)
                DrawList.AddRect(a, b, col_line, 0, ImDrawFlags_RoundCornersAll, s.LineWeight);
        }
        EndItem();
    }
}